

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O2

void __thiscall SimpleSynapse::prepareNextState(SimpleSynapse *this)

{
  prepareNextState((SimpleSynapse *)&this[-1].differential.eqnX0);
  return;
}

Assistant:

void SimpleSynapse::prepareNextState()
{
	if( simplePreNeuron && simplePreNeuron->hasEvent() ) {
		differential.init();
		stochNextStateIsPrepared = true;
	} else {
		differential.prepareNextState();
		stochNextStateIsPrepared = differential.isNextStatePrepared();
	}
}